

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O0

void save0(char *filename)

{
  byte bVar1;
  ostream *this;
  Am_Value local_2a0;
  Am_Value local_290;
  Am_Value local_280;
  Am_Value local_270;
  Am_Value local_260;
  Am_Value local_250;
  Am_Value local_240;
  Am_Value local_230;
  undefined4 local_220;
  long local_210;
  ofstream out_file;
  char *filename_local;
  
  std::ofstream::ofstream(&local_210,filename,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  if ((bVar1 & 1) == 0) {
    Am_Load_Save_Context::Reset();
    Am_Value::Am_Value(&local_230,5);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_230);
    Am_Value::Am_Value(&local_240,0x44fc16);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_240);
    Am_Value::Am_Value(&local_250,true);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_250);
    Am_Value::Am_Value(&local_260,false);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_260);
    Am_Value::Am_Value(&local_270,54.234);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_270);
    Am_Value::Am_Value(&local_280,123.344);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_280);
    Am_Value::Am_Value(&local_290,'a');
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_290);
    Am_Value::Am_Value(&local_2a0,"Hello this is a test to see what\n happens");
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&local_210);
    Am_Value::~Am_Value(&local_2a0);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"open failed");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  }
  local_220 = 1;
  std::ofstream::~ofstream(&local_210);
  return;
}

Assistant:

void
save0(const char *filename)
{
  // create file for output
  std::ofstream out_file(filename, std::ios::out);
  if (!out_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // write some plain data objects to the stream
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(5));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((long)4520982));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(true));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(false));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((float)54.234));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(123.344));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value('a'));
  Am_Default_Load_Save_Context.Save(
      out_file, Am_Value("Hello this is a test to see what\n happens"));

  return;
}